

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O3

X509_POLICY_LEVEL * x509_policy_level_new(void)

{
  X509_POLICY_LEVEL *orig_ptr;
  OPENSSL_STACK *pOVar1;
  
  orig_ptr = (X509_POLICY_LEVEL *)OPENSSL_zalloc(0x10);
  if (orig_ptr != (X509_POLICY_LEVEL *)0x0) {
    pOVar1 = OPENSSL_sk_new(x509_policy_node_cmp);
    orig_ptr->nodes = (stack_st_X509_POLICY_NODE *)pOVar1;
    if (pOVar1 != (OPENSSL_STACK *)0x0) {
      return orig_ptr;
    }
    OPENSSL_sk_pop_free_ex
              ((OPENSSL_STACK *)0x0,sk_X509_POLICY_NODE_call_free_func,x509_policy_node_free);
    OPENSSL_free(orig_ptr);
  }
  return (X509_POLICY_LEVEL *)0x0;
}

Assistant:

static X509_POLICY_LEVEL *x509_policy_level_new(void) {
  X509_POLICY_LEVEL *level = reinterpret_cast<X509_POLICY_LEVEL *>(
      OPENSSL_zalloc(sizeof(X509_POLICY_LEVEL)));
  if (level == NULL) {
    return NULL;
  }
  level->nodes = sk_X509_POLICY_NODE_new(x509_policy_node_cmp);
  if (level->nodes == NULL) {
    x509_policy_level_free(level);
    return NULL;
  }
  return level;
}